

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.c
# Opt level: O0

char * ecs_module_path_from_c(char *c_name)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char local_459;
  char *pcStack_458;
  char ch;
  char *ptr;
  ecs_strbuf_t str;
  char *c_name_local;
  
  str._1080_8_ = c_name;
  memset(&ptr,0,0x440);
  for (pcStack_458 = (char *)str._1080_8_; local_459 = *pcStack_458, local_459 != '\0';
      pcStack_458 = pcStack_458 + 1) {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)local_459] & 0x100) != 0) {
      iVar1 = tolower((int)local_459);
      local_459 = ecs_to_i8((long)iVar1);
      if (pcStack_458 != (char *)str._1080_8_) {
        ecs_strbuf_appendstrn((ecs_strbuf_t *)&ptr,".",1);
      }
    }
    ecs_strbuf_appendstrn((ecs_strbuf_t *)&ptr,&local_459,1);
  }
  pcVar3 = ecs_strbuf_get((ecs_strbuf_t *)&ptr);
  return pcVar3;
}

Assistant:

char* ecs_module_path_from_c(
    const char *c_name)
{
    ecs_strbuf_t str = ECS_STRBUF_INIT;
    const char *ptr;
    char ch;

    for (ptr = c_name; (ch = *ptr); ptr++) {
        if (isupper(ch)) {
            ch = ecs_to_i8(tolower(ch));
            if (ptr != c_name) {
                ecs_strbuf_appendstrn(&str, ".", 1);
            }
        }

        ecs_strbuf_appendstrn(&str, &ch, 1);
    }

    return ecs_strbuf_get(&str);
}